

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

lm_trie_t * lm_trie_read_bin(uint32 *counts,int order,FILE *fp)

{
  lm_trie_t *trie_00;
  long lVar1;
  lm_trie_quant_t *local_30;
  lm_trie_t *trie;
  FILE *fp_local;
  int order_local;
  uint32 *counts_local;
  
  trie_00 = lm_trie_init(*counts);
  if (order < 2) {
    local_30 = (lm_trie_quant_t *)0x0;
  }
  else {
    local_30 = lm_trie_quant_read_bin(fp,order);
  }
  trie_00->quant = local_30;
  lVar1 = ftell((FILE *)fp);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x194,"pos after quant: %ld\n",lVar1);
  lm_trie_read_ug(trie_00,counts,fp);
  lVar1 = ftell((FILE *)fp);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x196,"pos after ug: %ld\n",lVar1);
  if (1 < order) {
    lm_trie_alloc_ngram(trie_00,counts,order);
    fread(trie_00->ngram_mem,1,trie_00->ngram_mem_size,(FILE *)fp);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x19a,"#ngram_mem: %ld\n",trie_00->ngram_mem_size);
  }
  return trie_00;
}

Assistant:

lm_trie_t *
lm_trie_read_bin(uint32 * counts, int order, FILE * fp)
{
    lm_trie_t *trie = lm_trie_init(counts[0]);
    trie->quant = (order > 1) ? lm_trie_quant_read_bin(fp, order) : NULL;
    E_INFO("pos after quant: %ld\n", ftell(fp));
    lm_trie_read_ug(trie, counts, fp);
    E_INFO("pos after ug: %ld\n", ftell(fp));
    if (order > 1) {
        lm_trie_alloc_ngram(trie, counts, order);
        fread(trie->ngram_mem, 1, trie->ngram_mem_size, fp);
        E_INFO("#ngram_mem: %ld\n", trie->ngram_mem_size);
    }
    return trie;
}